

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O0

void Js::ByteCodeDumper::DumpBrEnvProperty
               (OpCode op,OpLayoutBrEnvProperty *data,FunctionBody *dumpFunction,
               ByteCodeReader *reader)

{
  uint uVar1;
  PropertyId propertyId;
  ScriptContext *this;
  PropertyRecord *this_00;
  char16 *pcVar2;
  PropertyRecord *pPropertyName;
  ScriptContext *scriptContext;
  ByteCodeReader *reader_local;
  FunctionBody *dumpFunction_local;
  OpLayoutBrEnvProperty *data_local;
  OpCode op_local;
  
  DumpOffset((int)data->RelativeJumpOffset,reader);
  this = FunctionProxy::GetScriptContext((FunctionProxy *)dumpFunction);
  propertyId = FunctionBody::GetReferencedPropertyId(dumpFunction,data->PropertyIdIndex);
  this_00 = ScriptContext::GetPropertyName(this,propertyId);
  uVar1 = data->SlotIndex;
  pcVar2 = PropertyRecord::GetBuffer(this_00);
  Output::Print(L"[%d].%s",(ulong)uVar1,pcVar2);
  return;
}

Assistant:

void ByteCodeDumper::DumpBrEnvProperty(OpCode op, const unaligned OpLayoutBrEnvProperty * data, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        DumpOffset(data->RelativeJumpOffset, reader);
        ScriptContext* scriptContext = dumpFunction->GetScriptContext();
        PropertyRecord const * pPropertyName = scriptContext->GetPropertyName(
            dumpFunction->GetReferencedPropertyId(data->PropertyIdIndex));
        Output::Print(_u("[%d].%s"), data->SlotIndex, pPropertyName->GetBuffer());
    }